

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_data_to_file.cpp
# Opt level: O1

void initialize_folder_name(void)

{
  tm *__tp;
  time_t now;
  char current_time [32];
  time_t local_40;
  char local_38 [32];
  
  local_40 = time((time_t *)0x0);
  __tp = gmtime(&local_40);
  create_folder("../benchmarking_files");
  strftime(local_38,0x20,"/%Y_%m_%d_%H_%M",__tp);
  nested_folder = concat("../benchmarking_files",local_38);
  create_folder(nested_folder);
  return;
}

Assistant:

void initialize_folder_name() {
    // get the current time
    struct tm* timenow;
    time_t now = time(NULL);
    timenow = gmtime(&now);
    char folder_name[32] = "../benchmarking_files";
    create_folder(folder_name);

    char current_time[32];
    strftime(current_time, sizeof(current_time), "/%Y_%m_%d_%H_%M", timenow);

    nested_folder = concat(folder_name, current_time);
    create_folder(nested_folder);
}